

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressStream_generic
                 (ZSTD_CStream *zcs,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective flushMode)

{
  ZSTD_cStreamStage ZVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  int iVar9;
  void *pvVar10;
  size_t sVar11;
  uint uVar12;
  ulong uVar13;
  size_t sVar14;
  char *dst;
  ulong uVar15;
  void *src;
  char *dst_00;
  size_t local_78;
  
  pvVar2 = input->src;
  pvVar10 = (void *)(input->size + (long)pvVar2);
  src = (void *)(input->pos + (long)pvVar2);
  pvVar3 = output->dst;
  sVar4 = output->size;
  dst = (char *)(output->pos + (long)pvVar3);
  do {
    ZVar1 = zcs->streamStage;
    if (ZVar1 == zcss_load) {
      if (flushMode == ZSTD_e_end) {
        sVar14 = (long)pvVar10 - (long)src;
        uVar8 = -(sVar14 - 0x20000) >> 0xb;
        if (0x1ffff < sVar14) {
          uVar8 = 0;
        }
        sVar11 = (long)pvVar3 + (sVar4 - (long)dst);
        if (((sVar14 >> 8) + sVar14 + uVar8 <= sVar11) && (zcs->inBuffPos == 0)) {
          sVar14 = ZSTD_compressEnd(zcs,dst,sVar11,src,sVar14);
          if (0xffffffffffffff88 < sVar14) {
            return sVar14;
          }
          dst = dst + sVar14;
          zcs->streamStage = zcss_init;
          zcs->frameEnded = 1;
          zcs->pledgedSrcSizePlusOne = 0;
          src = pvVar10;
          bVar6 = 0xffffffffffffff88 < sVar14;
          goto LAB_00426cd2;
        }
      }
      uVar13 = zcs->inBuffTarget - zcs->inBuffPos;
      uVar8 = (long)pvVar10 - (long)src;
      if (uVar13 < (ulong)((long)pvVar10 - (long)src)) {
        uVar8 = uVar13;
      }
      if (uVar8 != 0) {
        memcpy(zcs->inBuff + zcs->inBuffPos,src,uVar8);
      }
      uVar13 = zcs->inBuffPos + uVar8;
      zcs->inBuffPos = uVar13;
      if (flushMode == ZSTD_e_flush) {
        bVar5 = false;
        bVar7 = false;
        if (uVar13 != zcs->inToCompress) goto LAB_00426bfa;
      }
      else {
        if (flushMode == ZSTD_e_continue) {
          bVar5 = false;
          bVar7 = false;
          if (uVar13 < zcs->inBuffTarget) goto LAB_00426c01;
        }
LAB_00426bfa:
        bVar7 = true;
        bVar5 = true;
      }
LAB_00426c01:
      src = (void *)((long)src + uVar8);
      bVar6 = bVar7;
      if (bVar5) {
        sVar14 = uVar13 - zcs->inToCompress;
        uVar8 = -(sVar14 - 0x20000) >> 0xb;
        if (0x1ffff < sVar14) {
          uVar8 = 0;
        }
        sVar11 = (long)pvVar3 + (sVar4 - (long)dst);
        dst_00 = dst;
        if (sVar11 < (sVar14 >> 8) + sVar14 + uVar8) {
          dst_00 = zcs->outBuff;
          sVar11 = zcs->outBuffSize;
        }
        if (flushMode == ZSTD_e_end && src == pvVar10) {
          sVar14 = ZSTD_compressEnd(zcs,dst_00,sVar11,zcs->inBuff + zcs->inToCompress,sVar14);
        }
        else {
          sVar14 = ZSTD_compressContinue_internal
                             (zcs,dst_00,sVar11,zcs->inBuff + zcs->inToCompress,sVar14,1,0);
        }
        iVar9 = 1;
        if (sVar14 < 0xffffffffffffff89) {
          uVar12 = (uint)(flushMode == ZSTD_e_end && src == pvVar10);
          zcs->frameEnded = uVar12;
          uVar8 = zcs->inBuffPos + zcs->blockSize;
          zcs->inBuffTarget = uVar8;
          if (zcs->inBuffSize < uVar8) {
            zcs->inBuffPos = 0;
            zcs->inBuffTarget = zcs->blockSize;
          }
          zcs->inToCompress = zcs->inBuffPos;
          if (dst_00 == dst) {
            dst = dst + sVar14;
            iVar9 = 4;
            sVar14 = local_78;
            if (uVar12 != 0) {
              zcs->streamStage = zcss_init;
              zcs->pledgedSrcSizePlusOne = 0;
              bVar7 = false;
            }
          }
          else {
            zcs->outBuffContentSize = sVar14;
            zcs->outBuffFlushedSize = 0;
            zcs->streamStage = zcss_flush;
            iVar9 = 0;
            sVar14 = local_78;
          }
        }
        local_78 = sVar14;
        bVar6 = bVar7;
        if (iVar9 != 4) {
          if (iVar9 != 0) {
            return local_78;
          }
          goto LAB_00426ace;
        }
      }
    }
    else if (ZVar1 == zcss_flush) {
      bVar7 = true;
LAB_00426ace:
      uVar13 = zcs->outBuffContentSize - zcs->outBuffFlushedSize;
      uVar15 = (long)pvVar3 + (sVar4 - (long)dst);
      uVar8 = uVar13;
      if (uVar15 < uVar13) {
        uVar8 = uVar15;
      }
      if (uVar8 != 0) {
        memcpy(dst,zcs->outBuff + zcs->outBuffFlushedSize,uVar8);
      }
      zcs->outBuffFlushedSize = zcs->outBuffFlushedSize + uVar8;
      dst = dst + uVar8;
      bVar6 = false;
      if (uVar13 <= uVar15) {
        zcs->outBuffContentSize = 0;
        zcs->outBuffFlushedSize = 0;
        if (zcs->frameEnded == 0) {
          zcs->streamStage = zcss_load;
          bVar6 = bVar7;
        }
        else {
          zcs->streamStage = zcss_init;
          zcs->pledgedSrcSizePlusOne = 0;
        }
      }
    }
    else {
      bVar6 = true;
      if (ZVar1 == zcss_init) {
        return 0xffffffffffffffc2;
      }
    }
LAB_00426cd2:
    if (!bVar6) {
      input->pos = (long)src - (long)pvVar2;
      output->pos = (long)dst - (long)pvVar3;
      if (zcs->frameEnded == 0) {
        local_78 = zcs->inBuffTarget - zcs->inBuffPos;
        if (local_78 == 0) {
          local_78 = zcs->blockSize;
        }
      }
      else {
        local_78 = 0;
      }
      return local_78;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressStream_generic(ZSTD_CStream* zcs,
                                   ZSTD_outBuffer* output,
                                   ZSTD_inBuffer* input,
                                   ZSTD_EndDirective const flushMode)
{
    const char* const istart = (const char*)input->src;
    const char* const iend = istart + input->size;
    const char* ip = istart + input->pos;
    char* const ostart = (char*)output->dst;
    char* const oend = ostart + output->size;
    char* op = ostart + output->pos;
    U32 someMoreWork = 1;

    /* check expectations */
    DEBUGLOG(5, "ZSTD_compressStream_generic, flush=%u", (unsigned)flushMode);
    assert(zcs->inBuff != NULL);
    assert(zcs->inBuffSize > 0);
    assert(zcs->outBuff !=  NULL);
    assert(zcs->outBuffSize > 0);
    assert(output->pos <= output->size);
    assert(input->pos <= input->size);

    while (someMoreWork) {
        switch(zcs->streamStage)
        {
        case zcss_init:
            /* call ZSTD_initCStream() first ! */
            return ERROR(init_missing);

        case zcss_load:
            if ( (flushMode == ZSTD_e_end)
              && ((size_t)(oend-op) >= ZSTD_compressBound(iend-ip))  /* enough dstCapacity */
              && (zcs->inBuffPos == 0) ) {
                /* shortcut to compression pass directly into output buffer */
                size_t const cSize = ZSTD_compressEnd(zcs,
                                                op, oend-op, ip, iend-ip);
                DEBUGLOG(4, "ZSTD_compressEnd : cSize=%u", (unsigned)cSize);
                if (ZSTD_isError(cSize)) return cSize;
                ip = iend;
                op += cSize;
                zcs->frameEnded = 1;
                ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                someMoreWork = 0; break;
            }
            /* complete loading into inBuffer */
            {   size_t const toLoad = zcs->inBuffTarget - zcs->inBuffPos;
                size_t const loaded = ZSTD_limitCopy(
                                        zcs->inBuff + zcs->inBuffPos, toLoad,
                                        ip, iend-ip);
                zcs->inBuffPos += loaded;
                ip += loaded;
                if ( (flushMode == ZSTD_e_continue)
                  && (zcs->inBuffPos < zcs->inBuffTarget) ) {
                    /* not enough input to fill full block : stop here */
                    someMoreWork = 0; break;
                }
                if ( (flushMode == ZSTD_e_flush)
                  && (zcs->inBuffPos == zcs->inToCompress) ) {
                    /* empty */
                    someMoreWork = 0; break;
                }
            }
            /* compress current block (note : this stage cannot be stopped in the middle) */
            DEBUGLOG(5, "stream compression stage (flushMode==%u)", flushMode);
            {   void* cDst;
                size_t cSize;
                size_t const iSize = zcs->inBuffPos - zcs->inToCompress;
                size_t oSize = oend-op;
                unsigned const lastBlock = (flushMode == ZSTD_e_end) && (ip==iend);
                if (oSize >= ZSTD_compressBound(iSize))
                    cDst = op;   /* compress into output buffer, to skip flush stage */
                else
                    cDst = zcs->outBuff, oSize = zcs->outBuffSize;
                cSize = lastBlock ?
                        ZSTD_compressEnd(zcs, cDst, oSize,
                                    zcs->inBuff + zcs->inToCompress, iSize) :
                        ZSTD_compressContinue(zcs, cDst, oSize,
                                    zcs->inBuff + zcs->inToCompress, iSize);
                if (ZSTD_isError(cSize)) return cSize;
                zcs->frameEnded = lastBlock;
                /* prepare next block */
                zcs->inBuffTarget = zcs->inBuffPos + zcs->blockSize;
                if (zcs->inBuffTarget > zcs->inBuffSize)
                    zcs->inBuffPos = 0, zcs->inBuffTarget = zcs->blockSize;
                DEBUGLOG(5, "inBuffTarget:%u / inBuffSize:%u",
                         (unsigned)zcs->inBuffTarget, (unsigned)zcs->inBuffSize);
                if (!lastBlock)
                    assert(zcs->inBuffTarget <= zcs->inBuffSize);
                zcs->inToCompress = zcs->inBuffPos;
                if (cDst == op) {  /* no need to flush */
                    op += cSize;
                    if (zcs->frameEnded) {
                        DEBUGLOG(5, "Frame completed directly in outBuffer");
                        someMoreWork = 0;
                        ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                    }
                    break;
                }
                zcs->outBuffContentSize = cSize;
                zcs->outBuffFlushedSize = 0;
                zcs->streamStage = zcss_flush; /* pass-through to flush stage */
            }
	    /* fall-through */
        case zcss_flush:
            DEBUGLOG(5, "flush stage");
            {   size_t const toFlush = zcs->outBuffContentSize - zcs->outBuffFlushedSize;
                size_t const flushed = ZSTD_limitCopy(op, oend-op,
                            zcs->outBuff + zcs->outBuffFlushedSize, toFlush);
                DEBUGLOG(5, "toFlush: %u into %u ==> flushed: %u",
                            (unsigned)toFlush, (unsigned)(oend-op), (unsigned)flushed);
                op += flushed;
                zcs->outBuffFlushedSize += flushed;
                if (toFlush!=flushed) {
                    /* flush not fully completed, presumably because dst is too small */
                    assert(op==oend);
                    someMoreWork = 0;
                    break;
                }
                zcs->outBuffContentSize = zcs->outBuffFlushedSize = 0;
                if (zcs->frameEnded) {
                    DEBUGLOG(5, "Frame completed on flush");
                    someMoreWork = 0;
                    ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                    break;
                }
                zcs->streamStage = zcss_load;
                break;
            }

        default: /* impossible */
            assert(0);
        }
    }

    input->pos = ip - istart;
    output->pos = op - ostart;
    if (zcs->frameEnded) return 0;
    return ZSTD_nextInputSizeHint(zcs);
}